

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllTypes.cpp
# Opt level: O3

Type * slang::ast::PackedArrayType::fromDim
                 (Scope *scope,Type *elementType,ConstantRange dim,DeferredSourceRange sourceRange)

{
  Compilation *this;
  long lVar1;
  int iVar2;
  int iVar3;
  bitwidth_t bVar4;
  uint uVar5;
  Type *pTVar6;
  Diagnostic *this_00;
  int iVar7;
  bool bVar8;
  SourceRange sourceRange_00;
  unsigned_long local_38;
  ConstantRange local_30;
  
  pTVar6 = elementType->canonical;
  local_30 = dim;
  if (pTVar6 == (Type *)0x0) {
    Type::resolveCanonical(elementType);
    pTVar6 = elementType->canonical;
  }
  if ((pTVar6->super_Symbol).kind != ErrorType) {
    iVar7 = dim.left;
    iVar3 = dim.right;
    this = scope->compilation;
    iVar2 = iVar7 - iVar3;
    if (iVar7 - iVar3 == 0 || iVar7 < iVar3) {
      iVar2 = -(iVar7 - iVar3);
    }
    bVar4 = Type::getBitWidth(elementType);
    lVar1 = (ulong)bVar4 * (ulong)(iVar2 + 1U);
    bVar8 = (int)((ulong)lVar1 >> 0x20) != 0;
    uVar5 = (uint)lVar1;
    if (bVar8) {
      uVar5 = 0;
    }
    if ((bool)(~bVar8 & uVar5 < 0x1000000)) {
      local_38 = CONCAT44(local_38._4_4_,uVar5);
      elementType = (Type *)BumpAllocator::
                            emplace<slang::ast::PackedArrayType,slang::ast::Type_const&,slang::ConstantRange&,unsigned_int>
                                      (&this->super_BumpAllocator,elementType,&local_30,
                                       (uint *)&local_38);
      if ((SyntaxNode *)(sourceRange.node.value & 0xfffffffffffffffe) != (SyntaxNode *)0x0) {
        (((PackedArrayType *)elementType)->super_IntegralType).super_Type.super_Symbol.
        originatingSyntax = (SyntaxNode *)(sourceRange.node.value & 0xfffffffffffffffe);
      }
    }
    else {
      bVar4 = Type::getBitWidth(elementType);
      sourceRange_00 = slang::syntax::DeferredSourceRange::get(&sourceRange);
      this_00 = Scope::addDiag(scope,(DiagCode)0x1d0009,sourceRange_00);
      local_38 = (ulong)(iVar2 + 1U) * (ulong)bVar4;
      std::
      vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
      ::emplace_back<unsigned_long>(&this_00->args,&local_38);
      local_38 = 0xffffff;
      std::
      vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
      ::emplace_back<unsigned_long>(&this_00->args,&local_38);
      elementType = this->errorType;
    }
  }
  return (Type *)(PackedArrayType *)elementType;
}

Assistant:

const Type& PackedArrayType::fromDim(const Scope& scope, const Type& elementType, ConstantRange dim,
                                     DeferredSourceRange sourceRange) {
    if (elementType.isError())
        return elementType;

    auto& comp = scope.getCompilation();
    auto width = checkedMulU32(elementType.getBitWidth(), dim.width());
    if (!width || width > (uint32_t)SVInt::MAX_BITS) {
        uint64_t fullWidth = uint64_t(elementType.getBitWidth()) * dim.width();
        scope.addDiag(diag::PackedTypeTooLarge, sourceRange.get())
            << fullWidth << (uint32_t)SVInt::MAX_BITS;
        return comp.getErrorType();
    }

    auto result = comp.emplace<PackedArrayType>(elementType, dim, bitwidth_t(*width));
    if (auto syntax = sourceRange.syntax())
        result->setSyntax(*syntax);

    return *result;
}